

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O1

void __thiscall Clasp::WeightConstraint::undoLevel(WeightConstraint *this,Solver *s)

{
  int *piVar1;
  WL *pWVar2;
  WL WVar3;
  uint uVar4;
  uint32 idx;
  uint uVar5;
  uint uVar6;
  
  pWVar2 = this->lits_;
  if ((int)*pWVar2 < 0) {
    *(uint *)&this->field_0x1c = *(uint *)&this->field_0x1c & 1 | 2;
  }
  uVar6 = *(uint *)&this->field_0x10;
  uVar4 = uVar6 & 0x7ffffff;
  while (uVar4 != (uint)*pWVar2 >> 0x1f) {
    uVar4 = this->bound_[(long)(int)uVar4 + 1];
    uVar5 = uVar4 >> 2;
    if ((*(byte *)((long)(s->assign_).assign_.ebo_.buf +
                  (ulong)((uint)pWVar2[(ulong)(uVar5 << (SUB41(*pWVar2,3) >> 7)) + 1] & 0xfffffffc))
        & 3) != 0) break;
    *(byte *)(this->bound_ + (ulong)uVar5 + 2) = (byte)this->bound_[(ulong)uVar5 + 2] ^ 1;
    WVar3 = (WL)0x1;
    if ((int)*pWVar2 < 0) {
      WVar3 = pWVar2[(ulong)uVar5 * 2 + 2];
    }
    piVar1 = (int *)((long)this->bound_ + (ulong)(uVar4 & 2) * 2);
    *piVar1 = *piVar1 + (int)WVar3;
    uVar4 = uVar6 - 1 & 0x7ffffff;
    uVar6 = uVar6 & 0xf8000000 | uVar4;
    *(uint *)&this->field_0x10 = uVar6;
  }
  if (((this->field_0x1c & 1) == 0) &&
     (*(uint *)&this->field_0x10 = uVar6 | 0x30000000, -1 < (int)uVar6)) {
    WVar3 = *pWVar2;
    if (((uint)WVar3 & 0x3fffffff) != 1) {
      idx = 1;
      do {
        addWatch(this,s,idx,uVar6 >> 0x1e ^ FTB_BFB);
        idx = idx + 1;
      } while (((uint)WVar3 & 0x3fffffff) != idx);
    }
    this->field_0x13 = this->field_0x13 | 0xc0;
  }
  return;
}

Assistant:

void WeightConstraint::undoLevel(Solver& s) {
	setBpIndex(1);
	for (UndoInfo u; up_ != undoStart() && s.value(lits_->var((u=undoTop()).idx())) == value_free;) {
		assert(litSeen(u.idx()));
		toggleLitSeen(u.idx());
		bound_[u.constraint()] += weight(u.idx());
		--up_;
	}
	if (!litSeen(0)) {
		active_ = NOT_ACTIVE;
		if (watched_ < 2u) {
			ActiveConstraint other = static_cast<ActiveConstraint>(watched_^1);
			for (uint32 i = 1, end = size(); i != end; ++i) {
				addWatch(s, i, other);
			}
			watched_ = 3u;
		}
	}
}